

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
* __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
::insert_unique<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<char_const(&)[4]>>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
          *this,key_type *key,piecewise_construct_t *args,tuple<int_&&> *args_1,
          tuple<const_char_(&)[4]> *args_2)

{
  bool bVar1;
  node_type *pnVar2;
  node_type **ppnVar3;
  key_type *y;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_false>
  SVar4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  bVar5;
  iterator iVar6;
  bool local_b9;
  btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *local_b8;
  int local_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_90;
  bool local_79;
  btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *local_78;
  int local_70;
  iterator *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  iterator last;
  iterator *iter;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_false>
  res;
  tuple<const_char_(&)[4]> *args_local_2;
  tuple<int_&&> *args_local_1;
  piecewise_construct_t *args_local;
  key_type *key_local;
  btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *this_local;
  
  res.value._8_8_ = args_2;
  bVar1 = btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
          ::empty((btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                   *)this);
  if (bVar1) {
    pnVar2 = btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar2;
    ppnVar3 = btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::mutable_root((btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                              *)this);
    *ppnVar3 = pnVar2;
  }
  SVar4 = btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
          ::internal_locate<int>
                    ((btree<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                      *)this,key);
  bVar5._8_8_ = SVar4.value._8_8_;
  local_68 = (iterator *)SVar4.value.node;
  res.value.node._0_4_ = SVar4.value.position;
  last._8_8_ = &iter;
  uStack_60 = CONCAT44(res.value.node._4_4_,(uint)res.value.node);
  bVar5.node = (btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                *)(ulong)(uint)res.value.node;
  iter = local_68;
  bVar5 = internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>,std::pair<int_const,std::__cxx11::string>&,std::pair<int_const,std::__cxx11::string>*>>
                    ((btree<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
                      *)local_68,bVar5);
  local_78 = bVar5.node;
  local_70 = bVar5.position;
  local_58 = (undefined1  [8])local_78;
  last.node._0_4_ = local_70;
  if (local_78 !=
      (btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
       *)0x0) {
    y = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
               *)local_58);
    bVar1 = compare_keys<int,int>(this,key,y);
    if (!bVar1) {
      local_79 = false;
      std::
      pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
      ::
      pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_&,_bool,_true>
                (__return_storage_ptr__,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                  *)local_58,&local_79);
      return __return_storage_ptr__;
    }
  }
  local_a8 = *(undefined8 *)last._8_8_;
  uStack_a0 = (undefined4)*(undefined8 *)(last._8_8_ + 8);
  uStack_9c = (undefined4)((ulong)*(undefined8 *)(last._8_8_ + 8) >> 0x20);
  iVar6._12_4_ = 0;
  iVar6._0_12_ = *(undefined1 (*) [12])last._8_8_;
  iVar6 = internal_emplace<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<char_const(&)[4]>>
                    (this,iVar6,args,args_1,(tuple<const_char_(&)[4]> *)res.value._8_8_);
  local_b8 = iVar6.node;
  local_b0 = iVar6.position;
  local_b9 = true;
  local_90.node = local_b8;
  local_90.position = local_b0;
  std::
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  ::
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool,_true>
            (__return_storage_ptr__,&local_90,&local_b9);
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
        -> std::pair<iterator, bool> {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        auto res = internal_locate(key);
        iterator &iter = res.value;

        if (res.HasMatch()) {
            if (res.IsEq()) {
                // The key already exists in the tree, do nothing.
                return {iter, false};
            }
        } else {
            iterator last = internal_last(iter);
            if (last.node && !compare_keys(key, last.key())) {
                // The key already exists in the tree, do nothing.
                return {last, false};
            }
        }
        return {internal_emplace(iter, std::forward<Args>(args)...), true};
    }